

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh_asn1.cc
# Opt level: O0

dh_st * EVP_PKEY_get1_DH(EVP_PKEY *pkey)

{
  DH *dh_00;
  DH *dh;
  EVP_PKEY *pkey_local;
  
  dh_00 = (DH *)EVP_PKEY_get0_DH((EVP_PKEY *)pkey);
  if (dh_00 != (DH *)0x0) {
    DH_up_ref(dh_00);
  }
  return dh_00;
}

Assistant:

DH *EVP_PKEY_get1_DH(const EVP_PKEY *pkey) {
  DH *dh = EVP_PKEY_get0_DH(pkey);
  if (dh != NULL) {
    DH_up_ref(dh);
  }
  return dh;
}